

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  PrimRef *pPVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint index;
  ulong uVar14;
  unsigned_long uVar15;
  size_t *psVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  size_t local_58;
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  uVar15 = r->_end;
  if (uVar14 < uVar15) {
    auVar17._8_4_ = 0xff800000;
    auVar17._0_8_ = 0xff800000ff800000;
    auVar17._12_4_ = 0xff800000;
    auVar18 = ZEXT1664(auVar17);
    auVar19._8_4_ = 0x7f800000;
    auVar19._0_8_ = 0x7f8000007f800000;
    auVar19._12_4_ = 0x7f800000;
    auVar20 = ZEXT1664(auVar19);
    sVar13 = 0;
    auVar27._8_4_ = 0xddccb9a2;
    auVar27._0_8_ = 0xddccb9a2ddccb9a2;
    auVar27._12_4_ = 0xddccb9a2;
    auVar28._8_4_ = 0x5dccb9a2;
    auVar28._0_8_ = 0x5dccb9a25dccb9a2;
    auVar28._12_4_ = 0x5dccb9a2;
    auVar23 = ZEXT1664(auVar19);
    auVar26 = ZEXT1664(auVar17);
    local_58 = k;
    do {
      uVar12 = uVar14 & 0xffffffff;
      pBVar1 = (this->super_Points).vertices.items;
      if (uVar12 < (pBVar1->super_RawBufferView).num) {
        psVar16 = &pBVar1[itime].super_RawBufferView.stride;
        sVar9 = itime;
        do {
          auVar17 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12);
          uVar7 = vcmpps_avx512vl(auVar17,auVar27,6);
          uVar8 = vcmpps_avx512vl(auVar17,auVar28,1);
          if (((byte)((byte)uVar7 & (byte)uVar8) != 0xf) ||
             (*(float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12 + 0xc) < 0.0
             )) goto LAB_01f12afe;
          sVar9 = sVar9 + 1;
          psVar16 = psVar16 + 7;
        } while (sVar9 <= itime);
        psVar16 = &pBVar1[itime + 1].super_RawBufferView.stride;
        uVar10 = itime + 1;
        do {
          auVar17 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12);
          uVar7 = vcmpps_avx512vl(auVar17,auVar27,6);
          uVar8 = vcmpps_avx512vl(auVar17,auVar28,1);
          if (((byte)((byte)uVar7 & (byte)uVar8) != 0xf) ||
             (*(float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12 + 0xc) < 0.0
             )) goto LAB_01f12afe;
          uVar10 = uVar10 + 1;
          psVar16 = psVar16 + 7;
        } while (uVar10 <= itime + 1);
        pcVar2 = pBVar1[itime].super_RawBufferView.ptr_ofs;
        lVar11 = pBVar1[itime].super_RawBufferView.stride * uVar14;
        auVar17 = *(undefined1 (*) [16])(pcVar2 + lVar11);
        fVar6 = *(float *)(pcVar2 + lVar11 + 0xc) * (this->super_Points).maxRadiusScale;
        auVar30._4_4_ = fVar6;
        auVar30._0_4_ = fVar6;
        auVar30._8_4_ = fVar6;
        auVar30._12_4_ = fVar6;
        auVar19 = vsubps_avx(auVar17,auVar30);
        aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar19,ZEXT416(geomID),0x30);
        auVar29._0_4_ = auVar17._0_4_ + fVar6;
        auVar29._4_4_ = auVar17._4_4_ + fVar6;
        auVar29._8_4_ = auVar17._8_4_ + fVar6;
        auVar29._12_4_ = auVar17._12_4_ + fVar6;
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar29,ZEXT416((uint)uVar14),0x30);
        auVar17 = vminps_avx(auVar20._0_16_,(undefined1  [16])aVar4);
        auVar20 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar18._0_16_,(undefined1  [16])aVar5);
        auVar18 = ZEXT1664(auVar17);
        auVar31._0_4_ = aVar4.x + aVar5.x;
        auVar31._4_4_ = aVar4.y + aVar5.y;
        auVar31._8_4_ = aVar4.z + aVar5.z;
        auVar31._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
        auVar17 = vminps_avx(auVar23._0_16_,auVar31);
        auVar23 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar26._0_16_,auVar31);
        auVar26 = ZEXT1664(auVar17);
        sVar13 = sVar13 + 1;
        pPVar3 = prims->items;
        pPVar3[local_58].upper.field_0.field_1 = aVar5;
        pPVar3[local_58].lower.field_0.field_1 = aVar4;
        uVar15 = r->_end;
        local_58 = local_58 + 1;
      }
LAB_01f12afe:
      aVar24 = auVar26._0_16_;
      aVar21 = auVar23._0_16_;
      aVar25 = auVar18._0_16_;
      aVar22 = auVar20._0_16_;
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar15);
  }
  else {
    aVar22.m128[2] = INFINITY;
    aVar22._0_8_ = 0x7f8000007f800000;
    aVar22.m128[3] = INFINITY;
    aVar25.m128[2] = -INFINITY;
    aVar25._0_8_ = 0xff800000ff800000;
    aVar25.m128[3] = -INFINITY;
    sVar13 = 0;
    aVar21 = aVar22;
    aVar24 = aVar25;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar24;
  __return_storage_ptr__->end = sVar13;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }